

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeid.h
# Opt level: O0

void pybind11::detail::clean_type_id(string *name)

{
  undefined8 uVar1;
  pointer pcVar2;
  allocator<char> local_61;
  string local_60;
  _func_void_void_ptr *local_30;
  undefined1 local_28 [8];
  unique_ptr<char,_void_(*)(void_*)> res;
  int status;
  string *name_local;
  
  res._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Head_base<0UL,_char_*,_false>._M_head_impl
  ._4_4_ = 0;
  uVar1 = std::__cxx11::string::c_str();
  pcVar2 = (pointer)__cxa_demangle(uVar1,0,0,
                                   (undefined1 *)
                                   ((long)&res._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>.
                                           _M_t.super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.
                                           super__Head_base<0UL,_char_*,_false>._M_head_impl + 4));
  local_30 = free;
  std::unique_ptr<char,void(*)(void*)>::unique_ptr<void(*)(void*),void>
            ((unique_ptr<char,void(*)(void*)> *)local_28,pcVar2,&local_30);
  if (res._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Head_base<0UL,_char_*,_false>.
      _M_head_impl._4_4_ == 0) {
    pcVar2 = std::unique_ptr<char,_void_(*)(void_*)>::get
                       ((unique_ptr<char,_void_(*)(void_*)> *)local_28);
    std::__cxx11::string::operator=((string *)name,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"pybind11::",&local_61);
  erase_all(name,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::unique_ptr<char,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<char,_void_(*)(void_*)> *)local_28);
  return;
}

Assistant:

PYBIND11_NOINLINE void clean_type_id(std::string &name) {
#if defined(__GNUG__)
    int status = 0;
    std::unique_ptr<char, void (*)(void *)> res {
        abi::__cxa_demangle(name.c_str(), nullptr, nullptr, &status), std::free };
    if (status == 0)
        name = res.get();
#else
    detail::erase_all(name, "class ");
    detail::erase_all(name, "struct ");
    detail::erase_all(name, "enum ");
#endif
    detail::erase_all(name, "pybind11::");
}